

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenSIMDLoad(BinaryenModuleRef module,BinaryenOp op,uint32_t offset,uint32_t align,
                BinaryenExpressionRef ptr,char *memoryName)

{
  char *ptr_00;
  uint32_t op_00;
  SIMDLoad *pSVar1;
  Name memory;
  Address local_48;
  Address local_40;
  Builder local_38;
  char *local_30;
  char *memoryName_local;
  BinaryenExpressionRef ptr_local;
  uint local_18;
  uint32_t align_local;
  uint32_t offset_local;
  BinaryenOp op_local;
  BinaryenModuleRef module_local;
  
  local_30 = memoryName;
  memoryName_local = (char *)ptr;
  ptr_local._4_4_ = align;
  local_18 = offset;
  align_local = op;
  _offset_local = module;
  wasm::Builder::Builder(&local_38,module);
  op_00 = align_local;
  wasm::Address::Address(&local_40,(ulong)local_18);
  wasm::Address::Address(&local_48,(ulong)ptr_local._4_4_);
  ptr_00 = memoryName_local;
  memory = getMemoryName(_offset_local,local_30);
  pSVar1 = wasm::Builder::makeSIMDLoad
                     (&local_38,op_00,local_40,local_48,(Expression *)ptr_00,memory);
  return (BinaryenExpressionRef)pSVar1;
}

Assistant:

BinaryenExpressionRef BinaryenSIMDLoad(BinaryenModuleRef module,
                                       BinaryenOp op,
                                       uint32_t offset,
                                       uint32_t align,
                                       BinaryenExpressionRef ptr,
                                       const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeSIMDLoad(SIMDLoadOp(op),
                    Address(offset),
                    Address(align),
                    (Expression*)ptr,
                    getMemoryName(module, memoryName)));
}